

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lib.c
# Opt level: O1

int main(void)

{
  int iVar1;
  ulp_ring_ciphertext *r_ciphertext;
  ulp_ring_private_key *r_priv_key;
  ulp_ring_public_key *r_pub_key;
  uint8_t *decrypted;
  ulp_ciphertext *ciphertext;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  uint8_t *r_decrypted;
  uint64_t q;
  uint64_t se;
  uint64_t sk;
  uint8_t msg [12];
  ulp_ring_ciphertext *local_80;
  ulp_ring_private_key *local_78;
  ulp_ring_public_key *local_70;
  long *local_68;
  ulp_ciphertext *local_60;
  ulp_private_key *local_58;
  ulp_public_key *local_50;
  long *local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  long local_28;
  int local_20;
  
  ulp_generate_parameters(0xc0,0x60,&local_30,&local_38,&local_40);
  ulp_generate_key_pair(0xc0,0x60,local_30,local_38,local_40,&local_50,&local_58);
  local_28 = 0x6f57206f6c6c6548;
  local_20 = 0x21646c72;
  ulp_encrypt((uint8_t *)&local_28,local_50,&local_60);
  ulp_decrypt(local_60,local_58,(uint8_t **)&local_68);
  if (local_20 == (int)local_68[1] && local_28 == *local_68) {
    local_30 = 0x8673;
    local_38 = 0x52892b;
    local_40 = 0x1a9c290b0d397;
    ulp_ring_generate_key_pair(0x60,0x8673,0x52892b,0x1a9c290b0d397,&local_70,&local_78);
    ulp_ring_encrypt((uint8_t *)&local_28,local_70,&local_80);
    ulp_ring_decrypt(local_80,local_78,(uint8_t **)&local_48);
    if (local_20 == (int)local_48[1] && local_28 == *local_48) {
      ulp_free_public_key(local_50);
      ulp_free_private_key(local_58);
      ulp_free_ciphertext(local_60);
      free(local_68);
      ulp_ring_free_public_key(local_70);
      ulp_ring_free_private_key(local_78);
      ulp_ring_free_ciphertext(local_80);
      iVar1 = 0;
      goto LAB_0010133d;
    }
  }
  ulp_free_public_key(local_50);
  ulp_free_private_key(local_58);
  ulp_free_ciphertext(local_60);
  free(local_68);
  ulp_ring_free_public_key(local_70);
  ulp_ring_free_private_key(local_78);
  ulp_ring_free_ciphertext(local_80);
  iVar1 = 1;
LAB_0010133d:
  free(local_48);
  return iVar1;
}

Assistant:

int main() {

    // test U-LP functions for normal variant

    size_t n = 192;
    size_t l = 96;
    uint64_t sk;
    uint64_t se;
    uint64_t q;

    ulp_generate_parameters(n, l, &sk, &se, &q);

    ulp_public_key* pub_key;
    ulp_private_key* priv_key;
    ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key);

    uint8_t msg[] = {'H', 'e', 'l', 'l', 'o', ' ', 'W', 'o', 'r', 'l', 'd', '!'};

    ulp_ciphertext* ciphertext;
    ulp_encrypt(msg, pub_key, &ciphertext);

    uint8_t* decrypted;
    ulp_decrypt(ciphertext, priv_key, &decrypted);

    if(memcmp(msg, decrypted, l/8) != 0)
        goto error;


    // test U-LP functions for ring variant

    n = 96;
    sk = 34419;
    se = 5409067;
    q = 468128092967831;

    ulp_ring_public_key* r_pub_key;
    ulp_ring_private_key* r_priv_key;
    ulp_ring_generate_key_pair(n, sk, se, q, &r_pub_key, &r_priv_key);

    ulp_ring_ciphertext* r_ciphertext;
    ulp_ring_encrypt(msg, r_pub_key, &r_ciphertext);

    uint8_t* r_decrypted;
    ulp_ring_decrypt(r_ciphertext, r_priv_key, &r_decrypted);

    if(memcmp(msg, r_decrypted, n/8) != 0)
        goto error;


    // do cleanup

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    ulp_free_ciphertext(ciphertext);
    free(decrypted);
    ulp_ring_free_public_key(r_pub_key);
    ulp_ring_free_private_key(r_priv_key);
    ulp_ring_free_ciphertext(r_ciphertext);
    free(r_decrypted);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        ulp_free_ciphertext(ciphertext);
        free(decrypted);
        ulp_ring_free_public_key(r_pub_key);
        ulp_ring_free_private_key(r_priv_key);
        ulp_ring_free_ciphertext(r_ciphertext);
        free(r_decrypted);
        return 1;

}